

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O1

XVisualInfo *
sf::priv::GlxContext::selectBestVisual
          (XVisualInfo *__return_storage_ptr__,Display *display,uint bitsPerPixel,
          ContextSettings *settings)

{
  int iVar1;
  Visual *pVVar2;
  VisualID VVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  int iVar11;
  XVisualInfo *pXVar12;
  ostream *poVar13;
  long lVar14;
  int iVar15;
  int sRgb;
  int samples;
  int multiSampling;
  int count;
  uint local_60;
  int stencil;
  int depth;
  int alpha;
  int blue;
  int green;
  int red;
  int doubleBuffer;
  XVisualInfo *local_40;
  ContextSettings *local_38;
  
  local_60 = bitsPerPixel;
  local_38 = settings;
  anon_unknown.dwarf_279a12::ensureExtensionsInit(display,*(int *)(display + 0xe0));
  iVar1 = *(int *)(display + 0xe0);
  pXVar12 = (XVisualInfo *)XGetVisualInfo(display,0,0,&count);
  local_40 = pXVar12;
  if (pXVar12 == (XVisualInfo *)0x0) {
    poVar13 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"No GLX visual found. You should check your graphics driver",0x3a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    __return_storage_ptr__->visual = (Visual *)0x0;
    __return_storage_ptr__->visualid = 0;
    __return_storage_ptr__->screen = 0;
    __return_storage_ptr__->depth = 0;
    *(undefined8 *)&__return_storage_ptr__->c_class = 0;
    __return_storage_ptr__->red_mask = 0;
    __return_storage_ptr__->green_mask = 0;
    __return_storage_ptr__->blue_mask = 0;
    __return_storage_ptr__->colormap_size = 0;
    __return_storage_ptr__->bits_per_rgb = 0;
  }
  else {
    __return_storage_ptr__->blue_mask = 0;
    __return_storage_ptr__->colormap_size = 0;
    __return_storage_ptr__->bits_per_rgb = 0;
    __return_storage_ptr__->red_mask = 0;
    __return_storage_ptr__->green_mask = 0;
    __return_storage_ptr__->screen = 0;
    __return_storage_ptr__->depth = 0;
    *(undefined8 *)&__return_storage_ptr__->c_class = 0;
    __return_storage_ptr__->visual = (Visual *)0x0;
    __return_storage_ptr__->visualid = 0;
    if (0 < count) {
      iVar15 = 0x7fffffff;
      lVar14 = 0;
      do {
        if (pXVar12->screen == iVar1) {
          (*sf_glad_glXGetConfig)(display,pXVar12,5,&doubleBuffer);
          if (doubleBuffer != 0) {
            (*sf_glad_glXGetConfig)(display,pXVar12,8,&red);
            (*sf_glad_glXGetConfig)(display,pXVar12,9,&green);
            (*sf_glad_glXGetConfig)(display,pXVar12,10,&blue);
            (*sf_glad_glXGetConfig)(display,pXVar12,0xb,&alpha);
            (*sf_glad_glXGetConfig)(display,pXVar12,0xc,&depth);
            (*sf_glad_glXGetConfig)(display,pXVar12,0xd,&stencil);
            if (SF_GLAD_GLX_ARB_multisample == 0) {
              multiSampling = 0;
              samples = 0;
            }
            else {
              (*sf_glad_glXGetConfig)(display,pXVar12,100000,&multiSampling);
              (*sf_glad_glXGetConfig)(display,pXVar12,0x186a1,&samples);
            }
            if (SF_GLAD_GLX_ARB_framebuffer_sRGB == 0 && SF_GLAD_GLX_EXT_framebuffer_sRGB == 0) {
              sRgb = 0;
            }
            else {
              (*sf_glad_glXGetConfig)(display,pXVar12,0x20b2,&sRgb);
            }
            iVar11 = multiSampling;
            if (multiSampling != 0) {
              iVar11 = samples;
            }
            iVar11 = GlContext::evaluateFormat
                               (local_60,local_38,green + red + blue + alpha,depth,stencil,iVar11,
                                true,sRgb == 1);
            if (iVar11 < iVar15) {
              pVVar2 = pXVar12->visual;
              VVar3 = pXVar12->visualid;
              iVar7 = pXVar12->screen;
              iVar8 = pXVar12->depth;
              iVar9 = pXVar12->c_class;
              uVar10 = *(undefined4 *)&pXVar12->field_0x1c;
              uVar4 = pXVar12->red_mask;
              uVar5 = pXVar12->green_mask;
              iVar15 = pXVar12->colormap_size;
              iVar6 = pXVar12->bits_per_rgb;
              __return_storage_ptr__->blue_mask = pXVar12->blue_mask;
              __return_storage_ptr__->colormap_size = iVar15;
              __return_storage_ptr__->bits_per_rgb = iVar6;
              __return_storage_ptr__->red_mask = uVar4;
              __return_storage_ptr__->green_mask = uVar5;
              __return_storage_ptr__->screen = iVar7;
              __return_storage_ptr__->depth = iVar8;
              __return_storage_ptr__->c_class = iVar9;
              *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar10;
              __return_storage_ptr__->visual = pVVar2;
              __return_storage_ptr__->visualid = VVar3;
              iVar15 = iVar11;
            }
          }
        }
        lVar14 = lVar14 + 1;
        pXVar12 = pXVar12 + 1;
      } while (lVar14 < count);
    }
    XFree(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

XVisualInfo GlxContext::selectBestVisual(::Display* display, unsigned int bitsPerPixel, const ContextSettings& settings)
{
    // Make sure that extensions are initialized
    ensureExtensionsInit(display, DefaultScreen(display));

    const int screen = DefaultScreen(display);

    // Retrieve all the visuals
    int count;
    XVisualInfo* visuals = XGetVisualInfo(display, 0, NULL, &count);
    if (visuals)
    {
        // Evaluate all the returned visuals, and pick the best one
        int bestScore = 0x7FFFFFFF;
        XVisualInfo bestVisual = XVisualInfo();
        for (int i = 0; i < count; ++i)
        {
            // Filter by screen
            if (visuals[i].screen != screen)
                continue;

            // Check mandatory attributes
            int doubleBuffer;
            glXGetConfig(display, &visuals[i], GLX_DOUBLEBUFFER, &doubleBuffer);
            if (!doubleBuffer)
                continue;

            // Extract the components of the current visual
            int red, green, blue, alpha, depth, stencil, multiSampling, samples, sRgb;
            glXGetConfig(display, &visuals[i], GLX_RED_SIZE,     &red);
            glXGetConfig(display, &visuals[i], GLX_GREEN_SIZE,   &green);
            glXGetConfig(display, &visuals[i], GLX_BLUE_SIZE,    &blue);
            glXGetConfig(display, &visuals[i], GLX_ALPHA_SIZE,   &alpha);
            glXGetConfig(display, &visuals[i], GLX_DEPTH_SIZE,   &depth);
            glXGetConfig(display, &visuals[i], GLX_STENCIL_SIZE, &stencil);

            if (SF_GLAD_GLX_ARB_multisample)
            {
                glXGetConfig(display, &visuals[i], GLX_SAMPLE_BUFFERS_ARB, &multiSampling);
                glXGetConfig(display, &visuals[i], GLX_SAMPLES_ARB,        &samples);
            }
            else
            {
                multiSampling = 0;
                samples = 0;
            }

            if (SF_GLAD_GLX_EXT_framebuffer_sRGB || SF_GLAD_GLX_ARB_framebuffer_sRGB)
            {
                glXGetConfig(display, &visuals[i], GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB, &sRgb);
            }
            else
            {
                sRgb = 0;
            }

            // TODO: Replace this with proper acceleration detection
            bool accelerated = true;

            // Evaluate the visual
            int color = red + green + blue + alpha;
            int score = evaluateFormat(bitsPerPixel, settings, color, depth, stencil, multiSampling ? samples : 0, accelerated, sRgb == True);

            // If it's better than the current best, make it the new best
            if (score < bestScore)
            {
                bestScore = score;
                bestVisual = visuals[i];
            }
        }

        // Free the array of visuals
        XFree(visuals);

        return bestVisual;
    }
    else
    {
        // Should never happen...
        err() << "No GLX visual found. You should check your graphics driver" << std::endl;

        return XVisualInfo();
    }
}